

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O3

void Cmd_archivecvar(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *var_name;
  FBaseCVar *pFVar2;
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 == 1) {
    Printf("Usage: archivecvar <cvar>\n");
    return;
  }
  var_name = FCommandLine::operator[](argv,1);
  pFVar2 = FindCVar(var_name,(FBaseCVar **)0x0);
  if ((pFVar2 != (FBaseCVar *)0x0) && ((pFVar2->Flags >> 8 & 1) != 0)) {
    pFVar2->Flags = pFVar2->Flags | 1;
  }
  return;
}

Assistant:

CCMD (archivecvar)
{

	if (argv.argc() == 1)
	{
		Printf ("Usage: archivecvar <cvar>\n");
	}
	else
	{
		FBaseCVar *var = FindCVar (argv[1], NULL);

		if (var != NULL && (var->GetFlags() & CVAR_AUTO))
		{
			var->SetArchiveBit ();
		}
	}
}